

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O0

int Saig_ManDemiterNew(Aig_Man_t *pMan)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  uint uVar3;
  Aig_Obj_t *pAVar4;
  int local_50;
  uint local_4c;
  int k;
  int i;
  Aig_Obj_t *pFan1;
  Aig_Obj_t *pFan0;
  Aig_Obj_t *pTemp;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vSupp1;
  Vec_Ptr_t *vSupp0;
  Vec_Ptr_t *vSuper;
  Aig_Man_t *pMan_local;
  
  vSuper = (Vec_Ptr_t *)pMan;
  vSupp0 = Vec_PtrAlloc(100);
  for (local_4c = 0;
      (iVar2 = Saig_ManPoNum((Aig_Man_t *)vSuper), (int)local_4c < iVar2 &&
      ((pTemp = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vSuper[1].pArray,local_4c),
       *(int *)&vSuper[7].pArray == 0 ||
       (iVar2 = Saig_ManPoNum((Aig_Man_t *)vSuper),
       (int)local_4c < iVar2 - *(int *)&vSuper[7].pArray)))); local_4c = local_4c + 1) {
    printf("Output %3d : ",(ulong)local_4c);
    pAVar4 = Aig_ObjFanin0(pTemp);
    iVar2 = Aig_ObjIsConst1(pAVar4);
    if (iVar2 == 0) {
      pAVar4 = Aig_ObjFanin0(pTemp);
      iVar2 = Aig_ObjIsNode(pAVar4);
      if (iVar2 == 0) {
        printf("Terminal\n");
      }
      else {
        iVar2 = Aig_ObjFaninC0(pTemp);
        if (iVar2 == 0) {
          printf("AND  ");
          pAVar4 = Aig_ObjFanin0(pTemp);
          iVar2 = Aig_ObjRecognizeExor(pAVar4,&pFan1,(Aig_Obj_t **)&k);
          if (iVar2 == 0) {
            printf(" No");
          }
          else {
            printf(" Yes");
          }
          printf("\n");
        }
        else {
          pAVar4 = Aig_ObjFanin0(pTemp);
          Aig_ObjCollectSuper(pAVar4,vSupp0);
          uVar3 = Vec_PtrSize(vSupp0);
          printf("OR with %d inputs    ",(ulong)uVar3);
          iVar2 = Vec_PtrSize(vSupp0);
          if (iVar2 == 2) {
            pAVar4 = Aig_ObjFanin0(pTemp);
            iVar2 = Aig_ObjRecognizeExor(pAVar4,&pFan1,(Aig_Obj_t **)&k);
            if (iVar2 == 0) {
              printf(" No");
            }
            else {
              printf(" Yes");
              printf("\n");
              pVVar1 = vSuper;
              pAVar4 = Aig_Regular(pFan1);
              vSupp1 = Aig_Support((Aig_Man_t *)pVVar1,pAVar4);
              for (local_50 = 0; iVar2 = Vec_PtrSize(vSupp1), local_50 < iVar2;
                  local_50 = local_50 + 1) {
                pFan0 = (Aig_Obj_t *)Vec_PtrEntry(vSupp1,local_50);
                iVar2 = Saig_ObjIsLo((Aig_Man_t *)vSuper,pFan0);
                if (iVar2 != 0) {
                  uVar3 = Aig_ObjCioId(pFan0);
                  printf(" %d",(ulong)uVar3);
                }
              }
              printf("\n");
              Vec_PtrFree(vSupp1);
              pVVar1 = vSuper;
              pAVar4 = Aig_Regular(_k);
              pObj = (Aig_Obj_t *)Aig_Support((Aig_Man_t *)pVVar1,pAVar4);
              for (local_50 = 0; iVar2 = Vec_PtrSize((Vec_Ptr_t *)pObj), local_50 < iVar2;
                  local_50 = local_50 + 1) {
                pFan0 = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pObj,local_50);
                iVar2 = Saig_ObjIsLo((Aig_Man_t *)vSuper,pFan0);
                if (iVar2 != 0) {
                  uVar3 = Aig_ObjCioId(pFan0);
                  printf(" %d",(ulong)uVar3);
                }
              }
              printf("\n");
              Vec_PtrFree((Vec_Ptr_t *)pObj);
            }
            printf("\n");
          }
          else {
            printf("\n");
          }
        }
      }
    }
    else {
      iVar2 = Aig_ObjFaninC0(pTemp);
      if (iVar2 == 0) {
        printf("Const1\n");
      }
      else {
        printf("Const0\n");
      }
    }
  }
  Vec_PtrFree(vSupp0);
  return 1;
}

Assistant:

int Saig_ManDemiterNew( Aig_Man_t * pMan )
{
    Vec_Ptr_t * vSuper, * vSupp0, * vSupp1;
    Aig_Obj_t * pObj, * pTemp, * pFan0, * pFan1;
    int i, k;
    vSuper = Vec_PtrAlloc( 100 );
    Saig_ManForEachPo( pMan, pObj, i )
    {
        if ( pMan->nConstrs && i >= Saig_ManPoNum(pMan) - pMan->nConstrs )
            break;
        printf( "Output %3d : ", i );
        if ( Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) )
        {
            if ( !Aig_ObjFaninC0(pObj) )
                printf( "Const1\n" );
            else
                printf( "Const0\n" );
            continue;
        }
        if ( !Aig_ObjIsNode(Aig_ObjFanin0(pObj)) )
        {
            printf( "Terminal\n" );
            continue;
        }
        // check AND
        if ( !Aig_ObjFaninC0(pObj) )
        { 
            printf( "AND  " );
            if ( Aig_ObjRecognizeExor(Aig_ObjFanin0(pObj), &pFan0, &pFan1) )
                printf( " Yes" );
            else
                printf( " No" );
            printf( "\n" );
            continue;
        }
        // check OR
        Aig_ObjCollectSuper( Aig_ObjFanin0(pObj), vSuper );
        printf( "OR with %d inputs    ", Vec_PtrSize(vSuper) );
        if ( Vec_PtrSize(vSuper) == 2 )
        {
            if ( Aig_ObjRecognizeExor(Aig_ObjFanin0(pObj), &pFan0, &pFan1) )
            {
                printf( " Yes" );
                printf( "\n" );

                vSupp0 = Aig_Support( pMan, Aig_Regular(pFan0) );
                Vec_PtrForEachEntry( Aig_Obj_t *, vSupp0, pTemp, k )
                    if ( Saig_ObjIsLo(pMan, pTemp) )
                        printf( " %d", Aig_ObjCioId(pTemp) );
                printf( "\n" );
                Vec_PtrFree( vSupp0 );

                vSupp1 = Aig_Support( pMan, Aig_Regular(pFan1) );
                Vec_PtrForEachEntry( Aig_Obj_t *, vSupp1, pTemp, k )
                    if ( Saig_ObjIsLo(pMan, pTemp) )
                        printf( " %d", Aig_ObjCioId(pTemp) );
                printf( "\n" );
                Vec_PtrFree( vSupp1 );
            }
            else
                printf( " No" );
            printf( "\n" );
            continue;
        }
/*
        Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pTemp, k )
            if ( Aig_ObjRecognizeExor(Aig_Regular(pTemp), &pFan0, &pFan1) )
            {
                printf( " Yes" );
                if ( Aig_IsComplement(pTemp) )
                    pFan0 = Aig_Not(pFan0);
            }
            else
                printf( " No" );
*/
        printf( "\n" );
    }
    Vec_PtrFree( vSuper );
    return 1;
}